

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbmp.c
# Opt level: O2

void putmbi(int i,_func_void_int_void_ptr *putout,void *out)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  
  iVar3 = 0;
  bVar2 = 0xf9;
  for (iVar1 = 0; iVar1 != i; iVar1 = iVar1 + (0x7f << (bVar2 & 0x1f) & i)) {
    bVar2 = bVar2 + 7;
    iVar3 = iVar3 + 1;
  }
  for (; 1 < iVar3; iVar3 = iVar3 + -1) {
    (*putout)((0x7f << (bVar2 & 0x1f) & i) >> (bVar2 & 0x1f) | 0x80,out);
    bVar2 = bVar2 - 7;
  }
  (*putout)(i & 0x7f,out);
  return;
}

Assistant:

void putmbi(int i, void (*putout)(int c, void *out), void *out)
{
	int cnt, l, accu;

	/* Get number of septets */
	accu = cnt = 0;
	while(accu != i) {
		accu += i & 0x7f << 7 * cnt++;
	}

	/* Produce the multibyte output */
	for(l = cnt - 1; l > 0; l--) {
		putout(0x80 | (i & 0x7f << 7 * l) >> 7 * l, out);
	}

	putout(i & 0x7f, out);
}